

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

QDnsMailExchangeRecord __thiscall
QList<QDnsMailExchangeRecord>::takeAt(QList<QDnsMailExchangeRecord> *this,qsizetype i)

{
  pointer pQVar1;
  char *in_RDX;
  
  (this->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar1 = data((QList<QDnsMailExchangeRecord> *)i);
  QDnsMailExchangeRecord::QDnsMailExchangeRecord
            ((QDnsMailExchangeRecord *)this,pQVar1 + (long)in_RDX);
  remove((QList<QDnsMailExchangeRecord> *)i,in_RDX);
  return (QSharedDataPointer<QDnsMailExchangeRecordPrivate>)
         (QSharedDataPointer<QDnsMailExchangeRecordPrivate>)this;
}

Assistant:

T takeAt(qsizetype i) { T t = std::move((*this)[i]); remove(i); return t; }